

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>_>_>
         *this)

{
  FloatFormat *pFVar1;
  double *pdVar2;
  bool *pbVar3;
  qpTestLog *pqVar4;
  ostringstream *poVar5;
  _Rb_tree_node_base *p_Var6;
  TestLog *pTVar7;
  Precision PVar8;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar9;
  Statement *pSVar10;
  ShaderExecutor *pSVar11;
  Variable<tcu::Matrix<float,_3,_4>_> *pVVar12;
  pointer pcVar13;
  double dVar14;
  undefined8 uVar15;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>_>_>
  *pBVar16;
  pointer pMVar17;
  bool bVar18;
  bool bVar19;
  int iVar20;
  _Rb_tree_node_base *p_Var21;
  Interval *pIVar22;
  IVal *pIVar23;
  MessageBuilder *pMVar24;
  undefined8 *puVar25;
  uint uVar26;
  undefined1 *puVar27;
  Matrix<float,_3,_4> *val;
  int row;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  char *pcVar32;
  qpTestLog *pqVar33;
  TestLog TVar34;
  IVal in2;
  IVal in3;
  FloatFormat highpFmt;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>_>_>
  outputs;
  Environment env;
  IVal in0;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  IVal in1;
  ResultCollector status;
  ostringstream oss;
  FuncSet funcs;
  deUint32 in_stack_fffffffffffff8a8;
  undefined4 uStack_754;
  size_type local_750;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_748;
  TestLog *local_738;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>_>_>
  *local_730;
  size_t local_728;
  IVal *local_720;
  string local_718;
  TestStatus *local_6f8;
  FloatFormat *local_6f0;
  FloatFormat local_6e8;
  long local_6c0;
  long local_6b8;
  long local_6b0;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>_>_>
  local_6a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_678;
  undefined1 local_648 [20];
  YesNoMaybe YStack_634;
  Interval IStack_630;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_618;
  undefined4 local_610;
  ios_base local_5d8 [8];
  ios_base local_5d0 [264];
  pointer local_4c8;
  pointer local_4c0;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_4b8;
  pointer local_458;
  pointer local_450;
  pointer local_448;
  pointer local_440;
  undefined1 local_438 [16];
  undefined1 local_428 [280];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  undefined1 local_2c8 [376];
  undefined1 local_150 [12];
  YesNoMaybe YStack_144;
  TestLog local_140;
  _Rb_tree_node_base *local_138;
  _Rb_tree_node_base *local_130;
  double local_128;
  
  this_00 = this->m_samplings;
  pFVar1 = &(this->m_caseCtx).floatFormat;
  PVar8 = (this->m_caseCtx).precision;
  sVar9 = (this->m_caseCtx).numRandoms;
  local_6f8 = __return_storage_ptr__;
  iVar20 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_6f0 = pFVar1;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,3,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_4b8,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar1,(FloatFormat *)(ulong)PVar8,(Precision)sVar9,(ulong)(iVar20 + 0xdeadbeef),
             in_stack_fffffffffffff8a8);
  pMVar17 = local_4b8.in0.
            super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_728 = ((long)local_4b8.in0.
                     super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_4b8.in0.
                     super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>_>_>::
  Outputs(&local_6a8,local_728);
  local_6e8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_6e8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_6e8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_6e8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_6e8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_6e8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_6e8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_6e8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_6e8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_678._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_678._M_impl.super__Rb_tree_header._M_header;
  local_678._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_678._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_678._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_678._M_impl.super__Rb_tree_header._M_header._M_right =
       local_678._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector((ResultCollector *)(local_428 + 0x110));
  local_738 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_458 = local_4b8.in0.
              super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_450 = local_4b8.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_448 = local_4b8.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_440 = local_4b8.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_4c8 = local_6a8.out0.
              super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_4c0 = local_6a8.out1.
              super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar5 = (ostringstream *)(local_648 + 8);
  local_648._0_8_ = local_738;
  std::__cxx11::ostringstream::ostringstream(poVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar5,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_648,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_730 = this;
  std::__cxx11::ostringstream::~ostringstream(poVar5);
  std::ios_base::~ios_base(local_5d0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
  p_Var6 = (_Rb_tree_node_base *)(local_150 + 8);
  local_150._8_4_ = _S_red;
  local_140.m_log = (qpTestLog *)0x0;
  local_128 = 0.0;
  pSVar10 = (local_730->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_138 = p_Var6;
  local_130 = p_Var6;
  (*pSVar10->_vptr_Statement[4])(pSVar10,local_150);
  if (local_138 != p_Var6) {
    p_Var21 = local_138;
    do {
      (**(code **)(**(long **)(p_Var21 + 1) + 0x30))(*(long **)(p_Var21 + 1),local_2c8);
      p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21);
    } while (p_Var21 != p_Var6);
  }
  pBVar16 = local_730;
  if (local_128 != 0.0) {
    poVar5 = (ostringstream *)(local_648 + 8);
    local_648._0_8_ = local_738;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5,(char *)local_438._0_8_,local_438._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_648,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_438._0_8_ != (IVal *)local_428) {
      operator_delete((void *)local_438._0_8_,local_428._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar5);
    std::ios_base::~ios_base(local_5d0);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_150);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
  std::ios_base::~ios_base((ios_base *)(local_2c8 + 0x70));
  pSVar11 = (pBVar16->m_executor).
            super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
            .m_data.ptr;
  pIVar23 = (IVal *)&local_4c8;
  (*pSVar11->_vptr_ShaderExecutor[2])(pSVar11,local_728,&local_458,pIVar23,0);
  tcu::Matrix<tcu::Interval,_3,_4>::Matrix((Matrix<tcu::Interval,_3,_4> *)local_648);
  tcu::Matrix<tcu::Interval,_3,_4>::Matrix((Matrix<tcu::Interval,_3,_4> *)local_2c8);
  tcu::Matrix<tcu::Interval,_3,_4>::Matrix((Matrix<tcu::Interval,_3,_4> *)local_150);
  Environment::bind<tcu::Matrix<float,3,4>>
            ((Environment *)&local_678,
             (pBVar16->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_4>_>_>.m_ptr,
             (IVal *)local_648);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_678,
             (pBVar16->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_438);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_678,
             (pBVar16->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&stack0xfffffffffffff8a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_678,
             (pBVar16->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_718);
  Environment::bind<tcu::Matrix<float,3,4>>
            ((Environment *)&local_678,
             (pBVar16->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_4>_>_>.m_ptr,
             (IVal *)local_2c8);
  Environment::bind<tcu::Matrix<float,3,4>>
            ((Environment *)&local_678,
             (pBVar16->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_4>_>_>.m_ptr,
             (IVal *)local_150);
  if (local_4b8.in0.
      super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish == pMVar17) {
    local_720 = (IVal *)0x0;
  }
  else {
    local_6c0 = local_728 + (local_728 == 0);
    lVar29 = 0;
    local_720 = (IVal *)0x0;
    do {
      pFVar1 = local_6f0;
      tcu::Matrix<tcu::Interval,_3,_4>::Matrix((Matrix<tcu::Interval,_3,_4> *)local_2c8);
      tcu::Matrix<tcu::Interval,_3,_4>::Matrix((Matrix<tcu::Interval,_3,_4> *)local_150);
      local_6b0 = lVar29 * 0x30;
      round<tcu::Matrix<float,3,4>>
                ((IVal *)local_438,(shaderexecutor *)pFVar1,
                 (FloatFormat *)
                 (local_4b8.in0.
                  super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar29),(Matrix<float,_3,_4> *)pIVar23
                );
      ContainerTraits<tcu::Matrix<float,_3,_4>,_tcu::Matrix<tcu::Interval,_3,_4>_>::doConvert
                ((IVal *)local_648,pFVar1,(IVal *)local_438);
      pIVar22 = (Interval *)
                Environment::lookup<tcu::Matrix<float,3,4>>
                          ((Environment *)&local_678,
                           (local_730->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_4>_>_>
                           .m_ptr);
      pBVar16 = local_730;
      lVar28 = 0;
      pMVar24 = (MessageBuilder *)local_648;
      do {
        lVar30 = 0;
        do {
          *(undefined8 *)((long)&pIVar22->m_hi + lVar30) =
               *(undefined8 *)(&pMVar24->field_0x10 + lVar30);
          puVar25 = (undefined8 *)((long)&pMVar24->m_log + lVar30);
          dVar14 = (double)puVar25[1];
          pbVar3 = &((Vector<tcu::Vector<tcu::Interval,_3>,_4> *)&pIVar22->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar30;
          *(undefined8 *)pbVar3 = *puVar25;
          *(double *)(pbVar3 + 8) = dVar14;
          lVar30 = lVar30 + 0x48;
        } while (lVar30 != 0x120);
        lVar28 = lVar28 + 1;
        pIVar22 = pIVar22 + 1;
        pMVar24 = (MessageBuilder *)&pMVar24->field_0x18;
      } while (lVar28 != 3);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_678,
                 (local_730->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_678,
                 (pBVar16->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_678,
                 (pBVar16->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      IStack_630.m_hi._0_4_ = (pBVar16->m_caseCtx).precision;
      IStack_630.m_lo = pFVar1->m_maxValue;
      local_648._0_8_ = *(undefined8 *)pFVar1;
      local_648._8_4_ = pFVar1->m_fractionBits;
      local_648._12_4_ = pFVar1->m_hasSubnormal;
      local_648._16_4_ = pFVar1->m_hasInf;
      YStack_634 = pFVar1->m_hasNaN;
      IStack_630.m_hasNaN = pFVar1->m_exactPrecision;
      IStack_630._1_3_ = *(undefined3 *)&pFVar1->field_0x19;
      IStack_630._4_4_ = *(undefined4 *)&pFVar1->field_0x1c;
      local_610 = 0;
      pSVar10 = (pBVar16->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_618 = &local_678;
      (*pSVar10->_vptr_Statement[3])(pSVar10,(MessageBuilder *)local_648);
      pIVar23 = Environment::lookup<tcu::Matrix<float,3,4>>
                          ((Environment *)&local_678,
                           (pBVar16->m_variables).out1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_4>_>_>
                           .m_ptr);
      lVar28 = local_6b0;
      ContainerTraits<tcu::Matrix<float,_3,_4>,_tcu::Matrix<tcu::Interval,_3,_4>_>::doConvert
                ((IVal *)local_648,&local_6e8,pIVar23);
      pBVar16 = local_730;
      puVar27 = local_150;
      lVar30 = 0;
      pMVar24 = (MessageBuilder *)local_648;
      do {
        lVar31 = 0;
        do {
          *(undefined8 *)(puVar27 + lVar31 + 0x10) = *(undefined8 *)(&pMVar24->field_0x10 + lVar31);
          puVar25 = (undefined8 *)((long)&pMVar24->m_log + lVar31);
          uVar15 = puVar25[1];
          *(undefined8 *)(puVar27 + lVar31) = *puVar25;
          *(undefined8 *)((long)(puVar27 + lVar31) + 8) = uVar15;
          lVar31 = lVar31 + 0x48;
        } while (lVar31 != 0x120);
        lVar30 = lVar30 + 1;
        puVar27 = puVar27 + 0x18;
        pMVar24 = (MessageBuilder *)&pMVar24->field_0x18;
      } while (lVar30 != 3);
      local_6b8 = lVar29;
      bVar18 = contains<tcu::Matrix<float,3,4>>
                         ((IVal *)local_150,
                          (Matrix<float,_3,_4> *)
                          ((long)((local_6a8.out1.
                                   super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].
                                 m_data + lVar28));
      local_648._0_8_ = local_648 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_648,"Shader output 1 is outside acceptable range","");
      bVar18 = tcu::ResultCollector::check
                         ((ResultCollector *)(local_428 + 0x110),bVar18,(string *)local_648);
      if ((TestLog *)local_648._0_8_ != (TestLog *)(local_648 + 0x10)) {
        operator_delete((void *)local_648._0_8_,CONCAT44(YStack_634,local_648._16_4_) + 1);
      }
      pIVar23 = Environment::lookup<tcu::Matrix<float,3,4>>
                          ((Environment *)&local_678,
                           (pBVar16->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_3,_4>,_tcu::Matrix<tcu::Interval,_3,_4>_>::doConvert
                ((IVal *)local_648,&local_6e8,pIVar23);
      puVar27 = local_2c8;
      lVar29 = 0;
      pMVar24 = (MessageBuilder *)local_648;
      do {
        lVar30 = 0;
        do {
          *(undefined8 *)(puVar27 + lVar30 + 0x10) = *(undefined8 *)(&pMVar24->field_0x10 + lVar30);
          puVar25 = (undefined8 *)((long)&pMVar24->m_log + lVar30);
          uVar15 = puVar25[1];
          *(undefined8 *)(puVar27 + lVar30) = *puVar25;
          *(undefined8 *)((long)(puVar27 + lVar30) + 8) = uVar15;
          lVar30 = lVar30 + 0x48;
        } while (lVar30 != 0x120);
        lVar29 = lVar29 + 1;
        puVar27 = puVar27 + 0x18;
        pMVar24 = (MessageBuilder *)&pMVar24->field_0x18;
      } while (lVar29 != 3);
      bVar19 = contains<tcu::Matrix<float,3,4>>
                         ((IVal *)local_2c8,
                          (Matrix<float,_3,_4> *)
                          ((long)((local_6a8.out0.
                                   super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].
                                 m_data + lVar28));
      local_648._0_8_ = local_648 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_648,"Shader output 0 is outside acceptable range","");
      bVar19 = tcu::ResultCollector::check
                         ((ResultCollector *)(local_428 + 0x110),bVar19,(string *)local_648);
      if ((TestLog *)local_648._0_8_ != (TestLog *)(local_648 + 0x10)) {
        operator_delete((void *)local_648._0_8_,CONCAT44(YStack_634,local_648._16_4_) + 1);
      }
      uVar26 = (int)local_720 + ((byte)~(bVar18 && bVar19) & 1);
      pIVar23 = (IVal *)(ulong)uVar26;
      local_720 = pIVar23;
      if ((int)uVar26 < 0x65 && (!bVar18 || !bVar19)) {
        local_648._0_8_ = local_738;
        poVar5 = (ostringstream *)(local_648 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar5);
        pcVar32 = "Failed";
        if (bVar18 && bVar19) {
          pcVar32 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,pcVar32,6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\t",1);
        pVVar12 = (pBVar16->m_variables).in0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_4>_>_>.
                  m_ptr;
        val = (Matrix<float,_3,_4> *)local_428;
        pcVar13 = (pVVar12->m_name)._M_dataplus._M_p;
        local_438._0_8_ = val;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_438,pcVar13,pcVar13 + (pVVar12->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,(char *)local_438._0_8_,local_438._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," = ",3);
        valueToString<tcu::Matrix<float,3,4>>
                  ((string *)&stack0xfffffffffffff8a8,(shaderexecutor *)&local_6e8,
                   (FloatFormat *)
                   ((long)((local_4b8.in0.
                            super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   lVar28),val);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,(char *)CONCAT44(uStack_754,in_stack_fffffffffffff8a8),
                   local_750);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_754,in_stack_fffffffffffff8a8) != &local_748) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_754,in_stack_fffffffffffff8a8),
                          local_748._M_allocated_capacity + 1);
        }
        if ((Matrix<float,_3,_4> *)local_438._0_8_ != (Matrix<float,_3,_4> *)local_428) {
          operator_delete((void *)local_438._0_8_,local_428._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\t",1);
        pVVar12 = (pBVar16->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_4>_>_>.
                  m_ptr;
        pIVar23 = (IVal *)local_428;
        pcVar13 = (pVVar12->m_name)._M_dataplus._M_p;
        local_438._0_8_ = pIVar23;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_438,pcVar13,pcVar13 + (pVVar12->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,(char *)local_438._0_8_,local_438._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," = ",3);
        valueToString<tcu::Matrix<float,3,4>>
                  ((string *)&stack0xfffffffffffff8a8,(shaderexecutor *)&local_6e8,
                   (FloatFormat *)
                   ((long)((local_6a8.out0.
                            super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   lVar28),(Matrix<float,_3,_4> *)pIVar23);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,(char *)CONCAT44(uStack_754,in_stack_fffffffffffff8a8),
                   local_750);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,3,4>>
                  (&local_718,(shaderexecutor *)&local_6e8,(FloatFormat *)local_2c8,pIVar23);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,local_718._M_dataplus._M_p,local_718._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_718._M_dataplus._M_p != &local_718.field_2) {
          operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_754,in_stack_fffffffffffff8a8) != &local_748) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_754,in_stack_fffffffffffff8a8),
                          local_748._M_allocated_capacity + 1);
        }
        if ((IVal *)local_438._0_8_ != (IVal *)local_428) {
          operator_delete((void *)local_438._0_8_,local_428._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\t",1);
        pVVar12 = (pBVar16->m_variables).out1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_4>_>_>.
                  m_ptr;
        pIVar23 = (IVal *)local_428;
        pcVar13 = (pVVar12->m_name)._M_dataplus._M_p;
        local_438._0_8_ = pIVar23;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_438,pcVar13,pcVar13 + (pVVar12->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,(char *)local_438._0_8_,local_438._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," = ",3);
        valueToString<tcu::Matrix<float,3,4>>
                  ((string *)&stack0xfffffffffffff8a8,(shaderexecutor *)&local_6e8,
                   (FloatFormat *)
                   ((long)((local_6a8.out1.
                            super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   lVar28),(Matrix<float,_3,_4> *)pIVar23);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,(char *)CONCAT44(uStack_754,in_stack_fffffffffffff8a8),
                   local_750);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,3,4>>
                  (&local_718,(shaderexecutor *)&local_6e8,(FloatFormat *)local_150,pIVar23);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,local_718._M_dataplus._M_p,local_718._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_718._M_dataplus._M_p != &local_718.field_2) {
          operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_754,in_stack_fffffffffffff8a8) != &local_748) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_754,in_stack_fffffffffffff8a8),
                          local_748._M_allocated_capacity + 1);
        }
        if ((IVal *)local_438._0_8_ != (IVal *)local_428) {
          operator_delete((void *)local_438._0_8_,local_428._0_8_ + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_648,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar5);
        std::ios_base::~ios_base(local_5d0);
      }
      lVar29 = local_6b8 + 1;
    } while (lVar29 != local_6c0);
  }
  iVar20 = (int)local_720;
  if (100 < iVar20) {
    poVar5 = (ostringstream *)(local_648 + 8);
    local_648._0_8_ = local_738;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"(Skipped ",9);
    std::ostream::operator<<(poVar5,iVar20 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_648,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar5);
    std::ios_base::~ios_base(local_5d0);
  }
  poVar5 = (ostringstream *)(local_648 + 8);
  if (iVar20 == 0) {
    local_648._0_8_ = local_738;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_648,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_648._0_8_ = local_738;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::ostream::operator<<(poVar5,iVar20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_648,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar5);
  std::ios_base::~ios_base(local_5d0);
  if (iVar20 == 0) {
    local_648._0_8_ = (TestLog *)(local_648 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_648,"Pass","");
    local_6f8->m_code = QP_TEST_RESULT_PASS;
    (local_6f8->m_description)._M_dataplus._M_p = (pointer)&(local_6f8->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6f8->m_description,local_648._0_8_,
               (long)(qpTestLog **)local_648._0_8_ + CONCAT44(local_648._12_4_,local_648._8_4_));
    if ((TestLog *)local_648._0_8_ == (TestLog *)(local_648 + 0x10)) goto LAB_009362ab;
    TVar34.m_log = (qpTestLog *)CONCAT44(YStack_634,local_648._16_4_);
    local_150._0_8_ = local_648._0_8_;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_648);
    std::ostream::operator<<(local_648,iVar20);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_648);
    std::ios_base::~ios_base(local_5d8);
    pTVar7 = (TestLog *)(local_648 + 0x10);
    local_648._0_8_ = pTVar7;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_648," test failed. Check log for the details","");
    pqVar4 = (qpTestLog *)
             (CONCAT44(local_648._12_4_,local_648._8_4_) + CONCAT44(YStack_144,local_150._8_4_));
    TVar34.m_log = (qpTestLog *)0xf;
    if ((TestLog *)local_150._0_8_ != &local_140) {
      TVar34.m_log = local_140.m_log;
    }
    if (TVar34.m_log < pqVar4) {
      pqVar33 = (qpTestLog *)0xf;
      if ((TestLog *)local_648._0_8_ != pTVar7) {
        pqVar33 = (qpTestLog *)CONCAT44(YStack_634,local_648._16_4_);
      }
      if (pqVar33 < pqVar4) goto LAB_0093612f;
      puVar25 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_648,0,(char *)0x0,local_150._0_8_);
    }
    else {
LAB_0093612f:
      puVar25 = (undefined8 *)std::__cxx11::string::_M_append(local_150,local_648._0_8_);
    }
    local_2c8._0_8_ = local_2c8 + 0x10;
    pdVar2 = (double *)(puVar25 + 2);
    if ((double *)*puVar25 == pdVar2) {
      local_2c8._16_8_ = *pdVar2;
      local_2c8._24_4_ = *(undefined4 *)(puVar25 + 3);
      local_2c8._28_4_ = *(undefined4 *)((long)puVar25 + 0x1c);
    }
    else {
      local_2c8._16_8_ = *pdVar2;
      local_2c8._0_8_ = (double *)*puVar25;
    }
    local_2c8._8_8_ = puVar25[1];
    *puVar25 = pdVar2;
    puVar25[1] = 0;
    *(undefined1 *)pdVar2 = 0;
    local_6f8->m_code = QP_TEST_RESULT_FAIL;
    (local_6f8->m_description)._M_dataplus._M_p = (pointer)&(local_6f8->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6f8->m_description,local_2c8._0_8_,
               (undefined1 *)(local_2c8._8_8_ + local_2c8._0_8_));
    if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
      operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
    }
    if ((TestLog *)local_648._0_8_ != pTVar7) {
      operator_delete((void *)local_648._0_8_,CONCAT44(YStack_634,local_648._16_4_) + 1);
    }
    TVar34.m_log = local_140.m_log;
    if ((TestLog *)local_150._0_8_ == &local_140) goto LAB_009362ab;
  }
  operator_delete((void *)local_150._0_8_,(ulong)((long)&(TVar34.m_log)->flags + 1));
LAB_009362ab:
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,local_2d8._M_allocated_capacity + 1);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310,local_300._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_678);
  if (local_6a8.out1.
      super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6a8.out1.
                    super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6a8.out1.
                          super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6a8.out1.
                          super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_6a8.out0.
      super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6a8.out0.
                    super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6a8.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6a8.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_4b8.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4b8.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_4b8.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4b8.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_4b8.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4b8.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_4b8.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4b8.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_4b8.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4b8.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_4b8.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4b8.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_4b8.in0.
      super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4b8.in0.
                    super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_4b8.in0.
                          super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4b8.in0.
                          super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_6f8;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}